

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBuilderUtil.cpp
# Opt level: O3

Move<vk::Handle<(vk::HandleType)21>_> * __thiscall
vk::DescriptorPoolBuilder::build
          (Move<vk::Handle<(vk::HandleType)21>_> *__return_storage_ptr__,DescriptorPoolBuilder *this
          ,DeviceInterface *vk,VkDevice device,VkDescriptorPoolCreateFlags flags,deUint32 maxSets)

{
  ulong uVar1;
  VkDescriptorPoolCreateInfo createInfo;
  VkDescriptorPoolCreateInfo local_30;
  
  local_30.pPoolSizes =
       (this->m_counts).
       super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
       _M_impl.super__Vector_impl_data._M_start;
  uVar1 = (long)(this->m_counts).
                super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)local_30.pPoolSizes;
  if (uVar1 == 0) {
    local_30.pPoolSizes = (pointer)0x0;
  }
  local_30.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
  local_30.pNext = (void *)0x0;
  local_30.poolSizeCount = (deUint32)(uVar1 >> 3);
  local_30.flags = flags;
  local_30.maxSets = maxSets;
  createDescriptorPool(__return_storage_ptr__,vk,device,&local_30,(VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkDescriptorPool> DescriptorPoolBuilder::build (const DeviceInterface& vk, VkDevice device, VkDescriptorPoolCreateFlags flags, deUint32 maxSets) const
{
	const VkDescriptorPoolSize* const	typeCountPtr	= (m_counts.empty()) ? (DE_NULL) : (&m_counts[0]);
	const VkDescriptorPoolCreateInfo	createInfo		=
	{
		VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
		DE_NULL,
		flags,
		maxSets,
		(deUint32)m_counts.size(),		// poolSizeCount
		typeCountPtr,					// pPoolSizes
	};

	return createDescriptorPool(vk, device, &createInfo);
}